

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

void Abc_SclPrintBufferTrees(SC_Man *p,Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pObj;
  int iVar1;
  Abc_Obj_t *pObj_00;
  long lVar2;
  int i;
  
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pObj_00 = Abc_NtkObj(pNtk,i);
    if ((pObj_00 != (Abc_Obj_t *)0x0) &&
       (((*(uint *)&pObj_00->field_0x14 & 0xf) != 7 || ((pObj_00->vFanins).nSize != 1)))) {
      iVar1 = Abc_SclCountBufferFanouts(pObj_00);
      if (3 < iVar1) {
        Abc_SclPrintBuffersOne(p,pObj_00,0);
        for (lVar2 = 0; lVar2 < (pObj_00->vFanouts).nSize; lVar2 = lVar2 + 1) {
          pObj = (Abc_Obj_t *)pObj_00->pNtk->vObjs->pArray[(pObj_00->vFanouts).pArray[lVar2]];
          if (((*(uint *)&pObj->field_0x14 & 0xf) == 7) && ((pObj->vFanins).nSize == 1)) {
            Abc_SclPrintBuffersInt(p,pObj,1);
          }
        }
        putchar(10);
      }
    }
  }
  return;
}

Assistant:

void Abc_SclPrintBufferTrees( SC_Man * p, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanout;
    int i, k;
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsBuffer(pObj) && Abc_SclCountBufferFanouts(pObj) > 3 )
        {           
            Abc_SclPrintBuffersOne( p, pObj, 0 );
            Abc_ObjForEachFanout( pObj, pFanout, k )
                if ( Abc_ObjIsBuffer(pFanout) )
                    Abc_SclPrintBuffersInt( p, pFanout, 1 );
            printf( "\n" );
        }
    }
}